

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

bool __thiscall
Clasp::Asp::PrgAtom::addConstraints(PrgAtom *this,LogicProgram *prg,ClauseCreator *gc)

{
  pointer pPVar1;
  PrgNode PVar2;
  pointer pVVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ClauseCreator *pCVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  pointer pPVar11;
  pointer pPVar12;
  byte bVar13;
  Result RVar14;
  Literal B;
  Literal local_4c;
  SharedContext *local_48;
  ClauseCreator *local_40;
  Literal local_34;
  
  local_48 = (prg->super_ProgramBuilder).ctx_;
  pPVar11 = (this->super_PrgHead).supports_.ebo_.buf;
  pCVar7 = ClauseCreator::start(gc,Static);
  local_34.rep_ = *(int *)&(this->super_PrgHead).super_PrgNode * 2 ^ 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (&pCVar7->literals_,&local_34);
  pPVar12 = (this->super_PrgHead).supports_.ebo_.buf;
  if ((this->super_PrgHead).supports_.ebo_.size == 0) {
    (this->super_PrgHead).supports_.ebo_.size = -(int)((ulong)((long)pPVar12 - (long)pPVar11) >> 2);
  }
  else {
    local_40 = gc;
    bVar13 = 0;
    do {
      uVar6 = pPVar12->rep;
      PVar2 = (&prg->bodies_)[(ulong)((uVar6 & 0xc) != 4) * 2].ebo_.buf[uVar6 >> 4]->super_PrgNode;
      uVar4 = PVar2._0_4_;
      local_4c.rep_ = uVar4 * 2;
      bVar9 = bVar13;
      if ((uVar4 & 0x7fffffff) != 1 && (PVar2._7_1_ >> 6 & 1) == 0) {
        pPVar11->rep = uVar6;
        uVar6 = pPVar12->rep;
        bVar9 = (byte)uVar6 >> 1;
        if ((bVar13 & 1) != 0) {
          bVar9 = 1;
        }
        if ((uVar6 & 0xc) != 8) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&gc->literals_,&local_4c);
          uVar6 = pPVar12->rep;
        }
        pPVar11 = pPVar11 + 1;
        if (((uVar6 & 2) == 0) &&
           (bVar5 = SharedContext::addBinary
                              (local_48,(Literal)(*(int *)&(this->super_PrgHead).super_PrgNode * 2),
                               (Literal)(local_4c.rep_ & 0xfffffffe ^ 2)), !bVar5)) {
          return false;
        }
      }
      pPVar12 = pPVar12 + 1;
      uVar6 = (this->super_PrgHead).supports_.ebo_.size;
      pPVar1 = (this->super_PrgHead).supports_.ebo_.buf + uVar6;
      bVar13 = bVar9;
    } while (pPVar12 != pPVar1);
    (this->super_PrgHead).supports_.ebo_.size =
         uVar6 - (int)((ulong)((long)pPVar1 - (long)pPVar11) >> 2);
    gc = local_40;
    if ((bVar9 & 1) != 0) {
LAB_0014b60d:
      uVar6 = *(uint *)&(this->super_PrgHead).super_PrgNode >> 1 & 0x3fffffff;
      pVVar3 = (local_48->varInfo_).ebo_.buf;
      bVar13 = pVVar3[uVar6].rep;
      if ((bVar13 & 0x20) == 0) {
        pVVar3[uVar6].rep = bVar13 | 0x20;
      }
      goto LAB_0014b662;
    }
  }
  uVar8 = (ulong)(this->deps_).ebo_.size;
  if (uVar8 != 0) {
    lVar10 = 0;
    do {
      if ((*(byte *)((long)&((this->deps_).ebo_.buf)->rep_ + lVar10) & 2) != 0) goto LAB_0014b60d;
      lVar10 = lVar10 + 4;
    } while (uVar8 << 2 != lVar10);
  }
LAB_0014b662:
  RVar14 = ClauseCreator::end(gc,0x100);
  return ((undefined1  [16])RVar14 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
}

Assistant:

bool PrgAtom::addConstraints(const LogicProgram& prg, ClauseCreator& gc) {
	SharedContext& ctx  = *prg.ctx();
	EdgeVec::iterator j = supports_.begin();
	bool           nant = false;
	gc.start().add(~literal());
	for (EdgeVec::iterator it = supports_.begin(); it != supports_.end(); ++it) {
		PrgNode* n = prg.getSupp(*it);
		Literal  B = n->literal();
		// consider only bodies which are part of the simplified program, i.e.
		// are associated with a variable in the solver.
		if (n->relevant() && n->hasVar()) {
			*j++ = *it;
			nant = nant || it->isChoice();
			if (!it->isDisj()) { gc.add(B); }
			if (it->isNormal() && !ctx.addBinary(literal(), ~B)) { // FTA/BFA
				return false;
			}
		}
	}
	supports_.erase(j, supports_.end());
	if (nant ||	hasDep(PrgAtom::dep_neg)) { ctx.setNant(var(), true); }
	return gc.end(ClauseCreator::clause_force_simplify);
}